

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllMatch.h
# Opt level: O0

void __thiscall
oout::AllMatch::AllMatch<oout::Match_const,oout::ContainMatch>
          (AllMatch *this,shared_ptr<const_oout::Match> *match1,
          shared_ptr<const_oout::Match> *matches,shared_ptr<oout::ContainMatch> *matches_1)

{
  initializer_list<std::shared_ptr<const_oout::Match>_> __l;
  shared_ptr<const_oout::Match> *local_b8;
  allocator<std::shared_ptr<const_oout::Match>_> local_81;
  shared_ptr<const_oout::Match> local_80;
  shared_ptr<const_oout::Match> local_70;
  shared_ptr<oout::Match_const> local_60 [16];
  shared_ptr<const_oout::Match> local_50;
  vector<std::shared_ptr<const_oout::Match>,_std::allocator<std::shared_ptr<const_oout::Match>_>_>
  local_40;
  shared_ptr<oout::ContainMatch> *local_28;
  shared_ptr<oout::ContainMatch> *matches_local_1;
  shared_ptr<const_oout::Match> *matches_local;
  shared_ptr<const_oout::Match> *match1_local;
  AllMatch *this_local;
  
  local_28 = matches_1;
  matches_local_1 = (shared_ptr<oout::ContainMatch> *)matches;
  matches_local = match1;
  match1_local = (shared_ptr<const_oout::Match> *)this;
  std::shared_ptr<const_oout::Match>::shared_ptr(&local_80,match1);
  std::shared_ptr<const_oout::Match>::shared_ptr
            (&local_70,(shared_ptr<const_oout::Match> *)matches_local_1);
  std::shared_ptr<oout::Match_const>::shared_ptr<oout::ContainMatch,void>(local_60,local_28);
  local_50.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
  local_50.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_80;
  std::allocator<std::shared_ptr<const_oout::Match>_>::allocator(&local_81);
  __l._M_len = (size_type)
               local_50.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
  __l._M_array = (iterator)
                 local_50.super___shared_ptr<const_oout::Match,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::
  vector<std::shared_ptr<const_oout::Match>,_std::allocator<std::shared_ptr<const_oout::Match>_>_>::
  vector(&local_40,__l,&local_81);
  AllMatch(this,&local_40);
  std::
  vector<std::shared_ptr<const_oout::Match>,_std::allocator<std::shared_ptr<const_oout::Match>_>_>::
  ~vector(&local_40);
  std::allocator<std::shared_ptr<const_oout::Match>_>::~allocator(&local_81);
  local_b8 = &local_50;
  do {
    local_b8 = local_b8 + -1;
    std::shared_ptr<const_oout::Match>::~shared_ptr(local_b8);
  } while (local_b8 != &local_80);
  return;
}

Assistant:

explicit AllMatch(
		const std::shared_ptr<const Match> &match1,
		const std::shared_ptr<T> & ... matches
	) : AllMatch(std::vector<std::shared_ptr<const Match>>{
		match1, matches...
	    })
	{
	}